

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O2

Slice __thiscall leveldb::FilterBlockBuilder::Finish(FilterBlockBuilder *this)

{
  string *dst;
  size_type sVar1;
  pointer puVar2;
  size_t i;
  ulong uVar3;
  Slice SVar4;
  
  if ((this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->start_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    GenerateFilter(this);
  }
  dst = &this->result_;
  sVar1 = (this->result_)._M_string_length;
  for (uVar3 = 0;
      puVar2 = (this->filter_offsets_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->filter_offsets_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar2 >> 2);
      uVar3 = uVar3 + 1) {
    PutFixed32(dst,puVar2[uVar3]);
  }
  PutFixed32(dst,(uint32_t)sVar1);
  std::__cxx11::string::push_back((char)dst);
  SVar4.data_ = (this->result_)._M_dataplus._M_p;
  SVar4.size_ = (this->result_)._M_string_length;
  return SVar4;
}

Assistant:

Slice FilterBlockBuilder::Finish() {
  if (!start_.empty()) {
    GenerateFilter();
  }

  // Append array of per-filter offsets
  const uint32_t array_offset = result_.size();
  for (size_t i = 0; i < filter_offsets_.size(); i++) {
    PutFixed32(&result_, filter_offsets_[i]);
  }

  PutFixed32(&result_, array_offset);
  result_.push_back(kFilterBaseLg);  // Save encoding parameter in result
  return Slice(result_);
}